

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBMPC.cpp
# Opt level: O1

int GetFormatGap(int drive_speed,DataRate datarate,Encoding encoding,int sectors,int size_)

{
  bool bVar1;
  int in_EAX;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  
  if (sectors == 0) {
    return 0;
  }
  lVar6 = 0x14;
  bVar8 = false;
  do {
    bVar1 = true;
    if ((((*(int *)("FitTrack: unable to fit " + lVar6 + 5) == drive_speed) &&
         (*(DataRate *)("FitTrack: unable to fit " + lVar6 + 9) == datarate)) &&
        (*(Encoding *)("FitTrack: unable to fit " + lVar6 + 0xd) == encoding)) &&
       ((*(int *)("FitTrack: unable to fit " + lVar6 + 0x11) == sectors &&
        (*(int *)("FitTrack: unable to fit " + lVar6 + 0x15) == size_)))) {
      in_EAX = *(int *)((long)&standard_gaps[0].drivespeed + lVar6);
      bVar1 = false;
    }
    if (!bVar1) break;
    lVar6 = lVar6 + 0x18;
    bVar8 = lVar6 == 0x5c;
  } while (!bVar8);
  if (bVar8) {
    iVar2 = GetRawTrackCapacity(drive_speed,datarate,encoding);
    iVar4 = iVar2 * 0x7cb >> 0x1f;
    iVar2 = (iVar2 * 0x7cb) / 2000 + iVar4;
    iVar3 = Sector::SizeCodeToLength(size_);
    iVar5 = iVar3 + 0x3e;
    iVar7 = (iVar2 + -0x92) - iVar4;
    if (encoding != MFM) {
      iVar5 = iVar3 + 0x21;
      iVar7 = (iVar2 + -0x49) - iVar4;
    }
    iVar4 = iVar7 / sectors - iVar5;
    iVar2 = 0x52;
    if (iVar4 < 0x52) {
      iVar2 = iVar4;
    }
    in_EAX = 0;
    if (iVar5 < iVar7 / sectors) {
      in_EAX = iVar2;
    }
  }
  return in_EAX;
}

Assistant:

int GetFormatGap(int drive_speed, DataRate datarate, Encoding encoding, int sectors, int size_)
{
    if (!sectors) return 0;

    // Check for common formats that use specific gap sizes
    for (auto& fg : standard_gaps)
    {
        // If the format matches exactly, return the known gap
        if (fg.drivespeed == drive_speed && fg.datarate == datarate && fg.encoding == encoding &&
            fg.sectors == sectors && fg.size == size_)
            return fg.gap3;
    }

    auto track_len = GetTrackCapacity(drive_speed, datarate, encoding) - GetTrackOverhead(encoding);
    auto chunk = track_len / sectors;
    auto overhead = Sector::SizeCodeToLength(size_) + GetSectorOverhead(encoding);
    auto gap3 = (chunk > overhead) ? chunk - overhead : 0;
    return (gap3 > MAX_GAP3) ? MAX_GAP3 : gap3;
}